

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::FindAnswers
          (GeneralizedSuffixTree *this,Node *node,uint cur_substring_length)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  pair<SuffixTree::Node_*,_unsigned_int> local_58;
  uint local_44;
  reference ppStack_40;
  uint num_substrings;
  pair<const_unsigned_int,_SuffixTree::Edge> *edge_pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *__range1;
  Node *pNStack_18;
  uint cur_substring_length_local;
  Node *node_local;
  GeneralizedSuffixTree *this_local;
  
  __range1._4_4_ = cur_substring_length;
  pNStack_18 = node;
  node_local = (Node *)this;
  __end1 = std::
           unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
           ::begin(&node->edges);
  edge_pair = (pair<const_unsigned_int,_SuffixTree::Edge> *)
              std::
              unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
              ::end(&node->edges);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                         *)&edge_pair);
    uVar1 = __range1._4_4_;
    if (!bVar2) break;
    ppStack_40 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
                 operator*(&__end1);
    if ((ppStack_40->second).length != 0) {
      FindAnswers(this,(ppStack_40->second).field_0.node,
                  __range1._4_4_ + (ppStack_40->second).length);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
    operator++(&__end1);
  }
  local_44 = pNStack_18->num_leaves - pNStack_18->num_lca;
  if (1 < local_44) {
    pvVar3 = std::
             vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
             ::operator[](&this->answers,(ulong)(local_44 - 1));
    if (pvVar3->second < uVar1) {
      std::pair<SuffixTree::Node_*,_unsigned_int>::pair<SuffixTree::Node_*&,_unsigned_int_&,_true>
                (&local_58,&stack0xffffffffffffffe8,(uint *)((long)&__range1 + 4));
      pvVar3 = std::
               vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
               ::operator[](&this->answers,(ulong)(local_44 - 1));
      std::pair<SuffixTree::Node_*,_unsigned_int>::operator=(pvVar3,&local_58);
    }
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::FindAnswers (Node *node, uint cur_substring_length)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
            FindAnswers (edge_pair.second.node, cur_substring_length + edge_pair.second.length);
    uint num_substrings = node->num_leaves - node->num_lca;
    if (num_substrings > 1 && cur_substring_length > answers[num_substrings - 1].second)
        answers[num_substrings - 1] = std::pair<Node *, uint> (node, cur_substring_length);
}